

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  bool bVar1;
  char *pcVar2;
  reference pbVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  const_iterator i;
  allocator local_51;
  string local_50 [8];
  string fullName;
  string *fileName_local;
  char *includeName_local;
  char *dir_local;
  cmFortranParser_s *this_local;
  
  fullName.field_2._8_8_ = fileName;
  bVar1 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,includeName);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = cmsys::SystemTools::FileExists(pcVar2,true);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,dir,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::__cxx11::string::operator+=(local_50,"/");
    std::__cxx11::string::operator+=(local_50,includeName);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,local_50);
      this_local._7_1_ = true;
    }
    else {
      local_78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->IncludePath);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_70,&local_78);
      while( true ) {
        local_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->IncludePath);
        bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
        if (!bVar1) break;
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_70);
        std::__cxx11::string::operator=(local_50,(string *)pbVar3);
        std::__cxx11::string::operator+=(local_50,"/");
        std::__cxx11::string::operator+=(local_50,includeName);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar2,true);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,local_50);
          this_local._7_1_ = true;
          goto LAB_00688060;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_70);
      }
      this_local._7_1_ = false;
    }
LAB_00688060:
    i._M_current._0_4_ = 1;
    std::__cxx11::string::~string(local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName.c_str(), true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = dir;
  fullName += "/";
  fullName += includeName;
  if (cmSystemTools::FileExists(fullName.c_str(), true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::vector<std::string>::const_iterator i = this->IncludePath.begin();
       i != this->IncludePath.end(); ++i) {
    fullName = *i;
    fullName += "/";
    fullName += includeName;
    if (cmSystemTools::FileExists(fullName.c_str(), true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}